

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_sse2.c
# Opt level: O0

void av1_calc_indices_dim1_sse2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int64_t iVar17;
  int64_t *in_RCX;
  undefined8 *in_RDX;
  longlong in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  short sVar18;
  ushort uVar19;
  short sVar21;
  ushort uVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  short sVar33;
  ushort uVar34;
  undefined1 auVar20 [16];
  __m128i a;
  __m128i p2;
  __m128i dist2;
  __m128i dist1;
  __m128i ind1;
  __m128i cmp;
  __m128i dist;
  int j_1;
  __m128i dist_min;
  __m128i d2;
  __m128i d1;
  __m128i ind;
  __m128i in;
  int i;
  int j;
  __m128i cents [8];
  __m128i sum;
  __m128i v_zero;
  int local_3fc;
  undefined1 local_3f8 [16];
  ulong local_3c8;
  ulong uStack_3c0;
  int local_3a0;
  int local_39c;
  undefined8 local_398 [16];
  long local_318;
  long lStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  int local_2f0;
  int local_2ec;
  int64_t *local_2e8;
  undefined8 *local_2e0;
  long local_2d8;
  undefined8 *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined2 local_294;
  undefined2 local_292;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  ulong uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  long local_c8;
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  ulong local_28;
  ulong uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_318 = 0;
  lStack_310 = 0;
  local_2f0 = in_R9D;
  local_2ec = in_R8D;
  local_2e8 = in_RCX;
  local_2e0 = in_RDX;
  local_2d8 = in_RSI;
  local_2d0 = in_RDI;
  for (local_39c = 0; local_39c < local_2f0; local_39c = local_39c + 1) {
    local_292 = *(undefined2 *)(local_2d8 + (long)local_39c * 2);
    local_2a = local_292;
    local_2c = local_292;
    local_2e = local_292;
    local_30 = local_292;
    local_32 = local_292;
    local_34 = local_292;
    local_36 = local_292;
    local_38 = local_292;
    local_48 = CONCAT26(local_292,CONCAT24(local_292,CONCAT22(local_292,local_292)));
    uVar5 = CONCAT26(local_292,CONCAT24(local_292,CONCAT22(local_292,local_292)));
    uStack_40 = uVar5;
    local_398[(long)local_39c * 2] = local_48;
    local_398[(long)local_39c * 2 + 1] = uVar5;
  }
  for (local_3a0 = 0; local_3a0 < local_2ec; local_3a0 = local_3a0 + 8) {
    local_290 = local_2d0;
    local_248 = *local_2d0;
    uStack_240 = local_2d0[1];
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_3c8 = 0;
    uStack_3c0 = 0;
    local_218 = local_248;
    uVar9 = local_218;
    uStack_210 = uStack_240;
    uVar10 = uStack_210;
    local_228 = local_398[0];
    uVar5 = local_228;
    uStack_220 = local_398[1];
    uVar8 = uStack_220;
    local_218._0_2_ = (short)local_248;
    local_218._2_2_ = (short)((ulong)local_248 >> 0x10);
    local_218._4_2_ = (short)((ulong)local_248 >> 0x20);
    local_218._6_2_ = (short)((ulong)local_248 >> 0x30);
    uStack_210._0_2_ = (short)uStack_240;
    uStack_210._2_2_ = (short)((ulong)uStack_240 >> 0x10);
    uStack_210._4_2_ = (short)((ulong)uStack_240 >> 0x20);
    uStack_210._6_2_ = (short)((ulong)uStack_240 >> 0x30);
    local_228._0_2_ = (short)local_398[0];
    local_228._2_2_ = (short)((ulong)local_398[0] >> 0x10);
    local_228._4_2_ = (short)((ulong)local_398[0] >> 0x20);
    local_228._6_2_ = (short)((ulong)local_398[0] >> 0x30);
    uStack_220._0_2_ = (short)local_398[1];
    uStack_220._2_2_ = (short)((ulong)local_398[1] >> 0x10);
    uStack_220._4_2_ = (short)((ulong)local_398[1] >> 0x20);
    uStack_220._6_2_ = (short)((ulong)local_398[1] >> 0x30);
    sVar18 = (short)local_218 - (short)local_228;
    sVar21 = local_218._2_2_ - local_228._2_2_;
    sVar23 = local_218._4_2_ - local_228._4_2_;
    sVar25 = local_218._6_2_ - local_228._6_2_;
    sVar27 = (short)uStack_210 - (short)uStack_220;
    sVar29 = uStack_210._2_2_ - uStack_220._2_2_;
    sVar31 = uStack_210._4_2_ - uStack_220._4_2_;
    sVar33 = uStack_210._6_2_ - uStack_220._6_2_;
    local_238 = local_398[0];
    uStack_230 = local_398[1];
    local_228._0_2_ = (short)local_228 - (short)local_218;
    local_228._2_2_ = local_228._2_2_ - local_218._2_2_;
    local_228._4_2_ = local_228._4_2_ - local_218._4_2_;
    local_228._6_2_ = local_228._6_2_ - local_218._6_2_;
    uStack_220._0_2_ = (short)uStack_220 - (short)uStack_210;
    uStack_220._2_2_ = uStack_220._2_2_ - uStack_210._2_2_;
    uStack_220._4_2_ = uStack_220._4_2_ - uStack_210._4_2_;
    uStack_220._6_2_ = uStack_220._6_2_ - uStack_210._6_2_;
    local_1d8 = CONCAT26(sVar25,CONCAT24(sVar23,CONCAT22(sVar21,sVar18)));
    uStack_1d0 = CONCAT26(sVar33,CONCAT24(sVar31,CONCAT22(sVar29,sVar27)));
    local_1e8 = CONCAT26(local_228._6_2_,
                         CONCAT24(local_228._4_2_,CONCAT22(local_228._2_2_,(short)local_228)));
    uStack_1e0 = CONCAT26(uStack_220._6_2_,
                          CONCAT24(uStack_220._4_2_,CONCAT22(uStack_220._2_2_,(short)uStack_220)));
    local_3f8._2_2_ =
         (ushort)(sVar21 < local_228._2_2_) * local_228._2_2_ |
         (ushort)(sVar21 >= local_228._2_2_) * sVar21;
    local_3f8._0_2_ =
         (ushort)(sVar18 < (short)local_228) * (short)local_228 |
         (ushort)(sVar18 >= (short)local_228) * sVar18;
    local_3f8._4_2_ =
         (ushort)(sVar23 < local_228._4_2_) * local_228._4_2_ |
         (ushort)(sVar23 >= local_228._4_2_) * sVar23;
    local_3f8._6_2_ =
         (ushort)(sVar25 < local_228._6_2_) * local_228._6_2_ |
         (ushort)(sVar25 >= local_228._6_2_) * sVar25;
    local_3f8._8_2_ =
         (ushort)(sVar27 < (short)uStack_220) * (short)uStack_220 |
         (ushort)(sVar27 >= (short)uStack_220) * sVar27;
    local_3f8._10_2_ =
         (ushort)(sVar29 < uStack_220._2_2_) * uStack_220._2_2_ |
         (ushort)(sVar29 >= uStack_220._2_2_) * sVar29;
    local_3f8._12_2_ =
         (ushort)(sVar31 < uStack_220._4_2_) * uStack_220._4_2_ |
         (ushort)(sVar31 >= uStack_220._4_2_) * sVar31;
    local_3f8._14_2_ =
         (ushort)(sVar33 < uStack_220._6_2_) * uStack_220._6_2_ |
         (ushort)(sVar33 >= uStack_220._6_2_) * sVar33;
    for (local_3fc = 1; local_3fc < local_2f0; local_3fc = local_3fc + 1) {
      uVar1 = local_398[(long)local_3fc * 2];
      uVar2 = local_398[(long)local_3fc * 2 + 1];
      local_258 = local_248;
      uStack_250 = uStack_240;
      local_268 = uVar1;
      uVar6 = local_268;
      uStack_260 = uVar2;
      uVar7 = uStack_260;
      local_268._0_2_ = (short)uVar1;
      local_268._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_268._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_268._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_260._0_2_ = (short)uVar2;
      uStack_260._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_260._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_260._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_268._0_2_ = (short)local_218 - (short)local_268;
      local_268._2_2_ = local_218._2_2_ - local_268._2_2_;
      local_268._4_2_ = local_218._4_2_ - local_268._4_2_;
      local_268._6_2_ = local_218._6_2_ - local_268._6_2_;
      uStack_260._0_2_ = (short)uStack_210 - (short)uStack_260;
      uStack_260._2_2_ = uStack_210._2_2_ - uStack_260._2_2_;
      uStack_260._4_2_ = uStack_210._4_2_ - uStack_260._4_2_;
      uStack_260._6_2_ = uStack_210._6_2_ - uStack_260._6_2_;
      uVar1 = local_398[(long)local_3fc * 2];
      uVar2 = local_398[(long)local_3fc * 2 + 1];
      local_278 = uVar1;
      uVar1 = local_278;
      uStack_270 = uVar2;
      uVar2 = uStack_270;
      local_288 = local_248;
      uStack_280 = uStack_240;
      local_278._0_2_ = (short)uVar1;
      local_278._2_2_ = (short)((ulong)uVar1 >> 0x10);
      local_278._4_2_ = (short)((ulong)uVar1 >> 0x20);
      local_278._6_2_ = (short)((ulong)uVar1 >> 0x30);
      uStack_270._0_2_ = (short)uVar2;
      uStack_270._2_2_ = (short)((ulong)uVar2 >> 0x10);
      uStack_270._4_2_ = (short)((ulong)uVar2 >> 0x20);
      uStack_270._6_2_ = (short)((ulong)uVar2 >> 0x30);
      local_278._0_2_ = (short)local_278 - (short)local_218;
      local_278._2_2_ = local_278._2_2_ - local_218._2_2_;
      local_278._4_2_ = local_278._4_2_ - local_218._4_2_;
      local_278._6_2_ = local_278._6_2_ - local_218._6_2_;
      uStack_270._0_2_ = (short)uStack_270 - (short)uStack_210;
      uStack_270._2_2_ = uStack_270._2_2_ - uStack_210._2_2_;
      uStack_270._4_2_ = uStack_270._4_2_ - uStack_210._4_2_;
      uStack_270._6_2_ = uStack_270._6_2_ - uStack_210._6_2_;
      local_1f8 = CONCAT26(local_268._6_2_,
                           CONCAT24(local_268._4_2_,CONCAT22(local_268._2_2_,(short)local_268)));
      uStack_1f0 = CONCAT26(uStack_260._6_2_,
                            CONCAT24(uStack_260._4_2_,CONCAT22(uStack_260._2_2_,(short)uStack_260)))
      ;
      local_208 = CONCAT26(local_278._6_2_,
                           CONCAT24(local_278._4_2_,CONCAT22(local_278._2_2_,(short)local_278)));
      uStack_200 = CONCAT26(uStack_270._6_2_,
                            CONCAT24(uStack_270._4_2_,CONCAT22(uStack_270._2_2_,(short)uStack_270)))
      ;
      uVar19 = (ushort)((short)local_268 < (short)local_278) * (short)local_278 |
               (ushort)((short)local_268 >= (short)local_278) * (short)local_268;
      uVar22 = (ushort)(local_268._2_2_ < local_278._2_2_) * local_278._2_2_ |
               (ushort)(local_268._2_2_ >= local_278._2_2_) * local_268._2_2_;
      uVar24 = (ushort)(local_268._4_2_ < local_278._4_2_) * local_278._4_2_ |
               (ushort)(local_268._4_2_ >= local_278._4_2_) * local_268._4_2_;
      uVar26 = (ushort)(local_268._6_2_ < local_278._6_2_) * local_278._6_2_ |
               (ushort)(local_268._6_2_ >= local_278._6_2_) * local_268._6_2_;
      uVar28 = (ushort)((short)uStack_260 < (short)uStack_270) * (short)uStack_270 |
               (ushort)((short)uStack_260 >= (short)uStack_270) * (short)uStack_260;
      uVar30 = (ushort)(uStack_260._2_2_ < uStack_270._2_2_) * uStack_270._2_2_ |
               (ushort)(uStack_260._2_2_ >= uStack_270._2_2_) * uStack_260._2_2_;
      uVar32 = (ushort)(uStack_260._4_2_ < uStack_270._4_2_) * uStack_270._4_2_ |
               (ushort)(uStack_260._4_2_ >= uStack_270._4_2_) * uStack_260._4_2_;
      uVar34 = (ushort)(uStack_260._6_2_ < uStack_270._6_2_) * uStack_270._6_2_ |
               (ushort)(uStack_260._6_2_ >= uStack_270._6_2_) * uStack_260._6_2_;
      local_1b8 = local_3f8._0_8_;
      uVar11 = local_1b8;
      uStack_1b0 = local_3f8._8_8_;
      uVar12 = uStack_1b0;
      local_1c8 = CONCAT26(uVar26,CONCAT24(uVar24,CONCAT22(uVar22,uVar19)));
      uStack_1c0 = CONCAT26(uVar34,CONCAT24(uVar32,CONCAT22(uVar30,uVar28)));
      local_1b8._0_2_ = local_3f8._0_2_;
      local_1b8._2_2_ = local_3f8._2_2_;
      local_1b8._4_2_ = local_3f8._4_2_;
      local_1b8._6_2_ = local_3f8._6_2_;
      uStack_1b0._0_2_ = local_3f8._8_2_;
      uStack_1b0._2_2_ = local_3f8._10_2_;
      uStack_1b0._4_2_ = local_3f8._12_2_;
      uStack_1b0._6_2_ = local_3f8._14_2_;
      local_198 = local_3f8._0_8_;
      uStack_190 = local_3f8._8_8_;
      local_1a8 = CONCAT26(uVar26,CONCAT24(uVar24,CONCAT22(uVar22,uVar19)));
      uStack_1a0 = CONCAT26(uVar34,CONCAT24(uVar32,CONCAT22(uVar30,uVar28)));
      local_3f8._2_2_ =
           ((short)uVar22 < local_1b8._2_2_) * uVar22 |
           (ushort)((short)uVar22 >= local_1b8._2_2_) * local_1b8._2_2_;
      local_3f8._0_2_ =
           ((short)uVar19 < (short)local_1b8) * uVar19 |
           (ushort)((short)uVar19 >= (short)local_1b8) * (short)local_1b8;
      local_3f8._4_2_ =
           ((short)uVar24 < local_1b8._4_2_) * uVar24 |
           (ushort)((short)uVar24 >= local_1b8._4_2_) * local_1b8._4_2_;
      local_3f8._6_2_ =
           ((short)uVar26 < local_1b8._6_2_) * uVar26 |
           (ushort)((short)uVar26 >= local_1b8._6_2_) * local_1b8._6_2_;
      local_3f8._8_2_ =
           ((short)uVar28 < (short)uStack_1b0) * uVar28 |
           (ushort)((short)uVar28 >= (short)uStack_1b0) * (short)uStack_1b0;
      local_3f8._10_2_ =
           ((short)uVar30 < uStack_1b0._2_2_) * uVar30 |
           (ushort)((short)uVar30 >= uStack_1b0._2_2_) * uStack_1b0._2_2_;
      local_3f8._12_2_ =
           ((short)uVar32 < uStack_1b0._4_2_) * uVar32 |
           (ushort)((short)uVar32 >= uStack_1b0._4_2_) * uStack_1b0._4_2_;
      local_3f8._14_2_ =
           ((short)uVar34 < uStack_1b0._6_2_) * uVar34 |
           (ushort)((short)uVar34 >= uStack_1b0._6_2_) * uStack_1b0._6_2_;
      local_294 = (undefined2)local_3fc;
      local_2 = (undefined2)local_3fc;
      local_4 = (undefined2)local_3fc;
      local_6 = (undefined2)local_3fc;
      local_8 = (undefined2)local_3fc;
      local_a = (undefined2)local_3fc;
      local_c = (undefined2)local_3fc;
      local_e = (undefined2)local_3fc;
      local_10 = (undefined2)local_3fc;
      local_28 = CONCAT26((undefined2)local_3fc,
                          CONCAT24((undefined2)local_3fc,
                                   CONCAT22((undefined2)local_3fc,(undefined2)local_3fc)));
      uStack_20 = CONCAT26((undefined2)local_3fc,
                           CONCAT24((undefined2)local_3fc,
                                    CONCAT22((undefined2)local_3fc,(undefined2)local_3fc)));
      uVar3 = CONCAT22(-(ushort)((short)uVar22 < local_1b8._2_2_),
                       -(ushort)((short)uVar19 < (short)local_1b8));
      local_158 = CONCAT26(-(ushort)((short)uVar26 < local_1b8._6_2_),
                           CONCAT24(-(ushort)((short)uVar24 < local_1b8._4_2_),uVar3));
      uVar4 = CONCAT22(-(ushort)((short)uVar30 < uStack_1b0._2_2_),
                       -(ushort)((short)uVar28 < (short)uStack_1b0));
      uStack_150 = CONCAT26(-(ushort)((short)uVar34 < uStack_1b0._6_2_),
                            CONCAT24(-(ushort)((short)uVar32 < uStack_1b0._4_2_),uVar4));
      uVar15 = local_158;
      uVar16 = uStack_150;
      local_168 = local_3c8;
      uVar13 = local_168;
      uStack_160 = uStack_3c0;
      uVar14 = uStack_160;
      local_158._4_4_ = (uint)((ulong)local_158 >> 0x20);
      uStack_150._4_4_ = (uint)((ulong)uStack_150 >> 0x20);
      local_168._0_4_ = (uint)local_3c8;
      local_168._4_4_ = (uint)(local_3c8 >> 0x20);
      uStack_160._0_4_ = (uint)uStack_3c0;
      uStack_160._4_4_ = (uint)(uStack_3c0 >> 0x20);
      local_178 = (uVar3 ^ 0xffffffff) & (uint)local_168;
      uStack_174 = (local_158._4_4_ ^ 0xffffffff) & local_168._4_4_;
      uStack_170 = (uVar4 ^ 0xffffffff) & (uint)uStack_160;
      uStack_16c = (uStack_150._4_4_ ^ 0xffffffff) & uStack_160._4_4_;
      local_138 = CONCAT26(-(ushort)((short)uVar26 < local_1b8._6_2_),
                           CONCAT24(-(ushort)((short)uVar24 < local_1b8._4_2_),
                                    CONCAT22(-(ushort)((short)uVar22 < local_1b8._2_2_),
                                             -(ushort)((short)uVar19 < (short)local_1b8))));
      uStack_130 = CONCAT26(-(ushort)((short)uVar34 < uStack_1b0._6_2_),
                            CONCAT24(-(ushort)((short)uVar32 < uStack_1b0._4_2_),
                                     CONCAT22(-(ushort)((short)uVar30 < uStack_1b0._2_2_),
                                              -(ushort)((short)uVar28 < (short)uStack_1b0))));
      local_148 = local_28;
      uStack_140 = uStack_20;
      local_188 = local_138 & local_28;
      uStack_180 = uStack_130 & uStack_20;
      local_3c8 = CONCAT44(uStack_174,local_178) | local_188;
      uStack_3c0 = CONCAT44(uStack_16c,uStack_170) | uStack_180;
      local_278 = uVar1;
      uStack_270 = uVar2;
      local_268 = uVar6;
      uStack_260 = uVar7;
      local_1b8 = uVar11;
      uStack_1b0 = uVar12;
      local_168 = uVar13;
      uStack_160 = uVar14;
      local_158 = uVar15;
      uStack_150 = uVar16;
    }
    if (local_2e8 != (int64_t *)0x0) {
      local_118 = local_3f8._0_8_;
      uStack_110 = local_3f8._8_8_;
      local_128 = local_3f8._0_8_;
      uStack_120 = local_3f8._8_8_;
      auVar20 = pmaddwd(local_3f8,local_3f8);
      local_3f8._0_8_ = auVar20._0_8_;
      local_3f8._8_8_ = auVar20._8_8_;
      local_f8 = local_3f8._0_8_;
      uVar2 = local_f8;
      uStack_f0 = local_3f8._8_8_;
      local_108 = local_308;
      uVar1 = local_108;
      uStack_100 = uStack_300;
      local_f8._0_4_ = auVar20._0_4_;
      local_f8._4_4_ = auVar20._4_4_;
      local_108._0_4_ = (undefined4)local_308;
      local_108._4_4_ = (undefined4)((ulong)local_308 >> 0x20);
      local_d8 = local_3f8._0_8_;
      uStack_d0 = local_3f8._8_8_;
      uVar7 = uStack_d0;
      local_e8 = local_308;
      uStack_e0 = uStack_300;
      uVar6 = uStack_e0;
      uStack_d0._0_4_ = auVar20._8_4_;
      uStack_d0._4_4_ = auVar20._12_4_;
      uStack_e0._0_4_ = (undefined4)uStack_300;
      uStack_e0._4_4_ = (undefined4)((ulong)uStack_300 >> 0x20);
      local_98 = local_318;
      lStack_90 = lStack_310;
      local_a8 = CONCAT44((undefined4)local_108,(undefined4)local_f8);
      lStack_a0 = CONCAT44(local_108._4_4_,local_f8._4_4_);
      local_b8 = local_318 + CONCAT44((undefined4)local_108,(undefined4)local_f8);
      lStack_b0 = lStack_310 + CONCAT44(local_108._4_4_,local_f8._4_4_);
      local_c8 = CONCAT44((undefined4)uStack_e0,(undefined4)uStack_d0);
      lStack_c0 = CONCAT44(uStack_e0._4_4_,uStack_d0._4_4_);
      local_318 = local_b8 + CONCAT44((undefined4)uStack_e0,(undefined4)uStack_d0);
      lStack_310 = lStack_b0 + CONCAT44(uStack_e0._4_4_,uStack_d0._4_4_);
      local_108 = uVar1;
      local_f8 = uVar2;
      uStack_e0 = uVar6;
      uStack_d0 = uVar7;
    }
    local_78 = local_3c8;
    uVar13 = local_78;
    uStack_70 = uStack_3c0;
    uVar14 = uStack_70;
    local_88 = local_308;
    uVar1 = local_88;
    uStack_80 = uStack_300;
    uVar2 = uStack_80;
    local_78._0_2_ = (short)local_3c8;
    local_78._2_2_ = (short)(local_3c8 >> 0x10);
    local_78._4_2_ = (short)(local_3c8 >> 0x20);
    local_78._6_2_ = (short)(local_3c8 >> 0x30);
    uStack_70._0_2_ = (short)uStack_3c0;
    uStack_70._2_2_ = (short)(uStack_3c0 >> 0x10);
    uStack_70._4_2_ = (short)(uStack_3c0 >> 0x20);
    uStack_70._6_2_ = (short)(uStack_3c0 >> 0x30);
    local_88._0_2_ = (short)local_308;
    local_88._2_2_ = (short)((ulong)local_308 >> 0x10);
    local_88._4_2_ = (short)((ulong)local_308 >> 0x20);
    local_88._6_2_ = (short)((ulong)local_308 >> 0x30);
    uStack_80._0_2_ = (short)uStack_300;
    uStack_80._2_2_ = (short)((ulong)uStack_300 >> 0x10);
    uStack_80._4_2_ = (short)((ulong)uStack_300 >> 0x20);
    uStack_80._6_2_ = (short)((ulong)uStack_300 >> 0x30);
    local_68 = CONCAT17((0 < uStack_70._6_2_) * (uStack_70._6_2_ < 0x100) *
                        (char)(uStack_3c0 >> 0x30) - (0xff < uStack_70._6_2_),
                        CONCAT16((0 < uStack_70._4_2_) * (uStack_70._4_2_ < 0x100) *
                                 (char)(uStack_3c0 >> 0x20) - (0xff < uStack_70._4_2_),
                                 CONCAT15((0 < uStack_70._2_2_) * (uStack_70._2_2_ < 0x100) *
                                          (char)(uStack_3c0 >> 0x10) - (0xff < uStack_70._2_2_),
                                          CONCAT14((0 < (short)uStack_70) *
                                                   ((short)uStack_70 < 0x100) * (char)uStack_3c0 -
                                                   (0xff < (short)uStack_70),
                                                   CONCAT13((0 < local_78._6_2_) *
                                                            (local_78._6_2_ < 0x100) *
                                                            (char)(local_3c8 >> 0x30) -
                                                            (0xff < local_78._6_2_),
                                                            CONCAT12((0 < local_78._4_2_) *
                                                                     (local_78._4_2_ < 0x100) *
                                                                     (char)(local_3c8 >> 0x20) -
                                                                     (0xff < local_78._4_2_),
                                                                     CONCAT11((0 < local_78._2_2_) *
                                                                              (local_78._2_2_ <
                                                                              0x100) * (char)(
                                                  local_3c8 >> 0x10) - (0xff < local_78._2_2_),
                                                  (0 < (short)local_78) * ((short)local_78 < 0x100)
                                                  * (char)local_3c8 - (0xff < (short)local_78)))))))
                       );
    local_50 = local_2e0;
    uStack_60 = CONCAT17((0 < uStack_80._6_2_) * (uStack_80._6_2_ < 0x100) *
                         (char)((ulong)uStack_300 >> 0x30) - (0xff < uStack_80._6_2_),
                         CONCAT16((0 < uStack_80._4_2_) * (uStack_80._4_2_ < 0x100) *
                                  (char)((ulong)uStack_300 >> 0x20) - (0xff < uStack_80._4_2_),
                                  CONCAT15((0 < uStack_80._2_2_) * (uStack_80._2_2_ < 0x100) *
                                           (char)((ulong)uStack_300 >> 0x10) -
                                           (0xff < uStack_80._2_2_),
                                           CONCAT14((0 < (short)uStack_80) *
                                                    ((short)uStack_80 < 0x100) * (char)uStack_300 -
                                                    (0xff < (short)uStack_80),
                                                    CONCAT13((0 < local_88._6_2_) *
                                                             (local_88._6_2_ < 0x100) *
                                                             (char)((ulong)local_308 >> 0x30) -
                                                             (0xff < local_88._6_2_),
                                                             CONCAT12((0 < local_88._4_2_) *
                                                                      (local_88._4_2_ < 0x100) *
                                                                      (char)((ulong)local_308 >>
                                                                            0x20) -
                                                                      (0xff < local_88._4_2_),
                                                                      CONCAT11((0 < local_88._2_2_)
                                                                               * (local_88._2_2_ <
                                                                                 0x100) *
                                                                               (char)((ulong)
                                                  local_308 >> 0x10) - (0xff < local_88._2_2_),
                                                  (0 < (short)local_88) * ((short)local_88 < 0x100)
                                                  * (char)local_308 - (0xff < (short)local_88)))))))
                        );
    *local_2e0 = local_68;
    local_2e0 = local_2e0 + 1;
    local_2d0 = local_2d0 + 2;
    local_228 = uVar5;
    uStack_220 = uVar8;
    local_218 = uVar9;
    uStack_210 = uVar10;
    local_88 = uVar1;
    uStack_80 = uVar2;
    local_78 = uVar13;
    uStack_70 = uVar14;
  }
  if (local_2e8 != (int64_t *)0x0) {
    a[1] = in_RSI;
    a[0] = (longlong)in_RDI;
    iVar17 = k_means_horizontal_sum_sse2(a);
    *local_2e8 = iVar17;
  }
  return;
}

Assistant:

void av1_calc_indices_dim1_sse2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m128i v_zero = _mm_setzero_si128();
  __m128i sum = _mm_setzero_si128();
  __m128i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    cents[j] = _mm_set1_epi16(centroids[j]);
  }

  for (int i = 0; i < n; i += 8) {
    const __m128i in = _mm_loadu_si128((__m128i *)data);
    __m128i ind = _mm_setzero_si128();
    // Compute the distance to the first centroid.
    __m128i d1 = _mm_sub_epi16(in, cents[0]);
    __m128i d2 = _mm_sub_epi16(cents[0], in);
    __m128i dist_min = _mm_max_epi16(d1, d2);

    for (int j = 1; j < k; ++j) {
      // Compute the distance to the centroid.
      d1 = _mm_sub_epi16(in, cents[j]);
      d2 = _mm_sub_epi16(cents[j], in);
      const __m128i dist = _mm_max_epi16(d1, d2);
      // Compare to the minimal one.
      const __m128i cmp = _mm_cmpgt_epi16(dist_min, dist);
      dist_min = _mm_min_epi16(dist_min, dist);
      const __m128i ind1 = _mm_set1_epi16(j);
      ind = _mm_or_si128(_mm_andnot_si128(cmp, ind), _mm_and_si128(cmp, ind1));
    }
    if (total_dist) {
      // Square, convert to 32 bit and add together.
      dist_min = _mm_madd_epi16(dist_min, dist_min);
      // Convert to 64 bit and add to sum.
      const __m128i dist1 = _mm_unpacklo_epi32(dist_min, v_zero);
      const __m128i dist2 = _mm_unpackhi_epi32(dist_min, v_zero);
      sum = _mm_add_epi64(sum, dist1);
      sum = _mm_add_epi64(sum, dist2);
    }
    __m128i p2 = _mm_packus_epi16(ind, v_zero);
    _mm_storel_epi64((__m128i *)indices, p2);
    indices += 8;
    data += 8;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_sse2(sum);
  }
}